

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O1

void __thiscall
TreeIncPruneBGPlanner::AddToCache_CrossSum
          (TreeIncPruneBGPlanner *this,Index a,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol,VectorSet *G)

{
  size_type __n;
  pointer pdVar1;
  size_type sVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  double *pdVar5;
  string key;
  string local_70;
  string local_50;
  
  if (this->_m_useVectorCache == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CrossSum","");
    ComputeKey(&local_50,this,a,depth,jpol,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](&this->_m_vectorSetCache,&local_50);
    sVar3 = G->size2_;
    pmVar4->size1_ = G->size1_;
    pmVar4->size2_ = sVar3;
    if (pmVar4 != G) {
      __n = (G->data_).size_;
      if ((pmVar4->data_).size_ != __n) {
        pdVar1 = (pmVar4->data_).data_;
        if (__n != 0) {
          pdVar5 = __gnu_cxx::new_allocator<double>::allocate
                             ((new_allocator<double> *)&pmVar4->data_,__n,(void *)0x0);
          (pmVar4->data_).data_ = pdVar5;
        }
        sVar2 = (pmVar4->data_).size_;
        if (sVar2 != 0) {
          operator_delete(pdVar1,sVar2 << 3);
        }
        if (__n == 0) {
          (pmVar4->data_).data_ = (pointer)0x0;
        }
        (pmVar4->data_).size_ = __n;
      }
      sVar2 = (G->data_).size_;
      if (sVar2 != 0) {
        memmove((pmVar4->data_).data_,(G->data_).data_,sVar2 << 3);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void TreeIncPruneBGPlanner::AddToCache_CrossSum(Index a,
                                                Index depth,
                                                const vector<vector<Index> > &jpol,
                                                const VectorSet &G)
{
    if(!_m_useVectorCache)
        return;

    string key=ComputeKey(a,depth,jpol,"CrossSum");

#if DEBUG_TreeIncPruneBGPlannerVerbose
    cout << "Adding CrossSum node to cache with key " << key 
#endif
#if 0
         << " vectorset " << SoftPrint(G) 
#endif
#if DEBUG_TreeIncPruneBGPlannerVerbose
         << " (jpol " << SoftPrintJpol(jpol) << ")" << endl;
#endif
    _m_vectorSetCache[key]=G;//.insert(std::pair<key,G>);
}